

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  
  if (pNtk->vPis->nSize != pNtkNew->vPis->nSize) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0xad,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize != pNtkNew->vPos->nSize) {
    __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0xae,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar2 = Nm_ManNumEntries(pNtk->pManName);
  if (iVar2 < 1) {
    __assert_fail("Nm_ManNumEntries(pNtk->pManName) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0xaf,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar2 = Nm_ManNumEntries(pNtkNew->pManName);
  if (iVar2 == 0) {
    for (iVar2 = 0; iVar2 < pNtk->vCis->nSize; iVar2 = iVar2 + 1) {
      pAVar3 = Abc_NtkCi(pNtk,iVar2);
      if (((pAVar3->vFanins).nSize == 0) ||
         ((*(uint *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x14) & 0xf) !=
          8)) {
        pAVar1 = (pAVar3->field_6).pCopy;
        pAVar3 = Abc_ObjFanout0Ntk(pAVar3);
        pcVar4 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar1,pcVar4,(char *)0x0);
      }
    }
    for (iVar2 = 0; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
      pAVar3 = Abc_NtkCo(pNtk,iVar2);
      if (((pAVar3->vFanouts).nSize == 0) ||
         ((*(uint *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray] + 0x14) & 0xf) !=
          8)) {
        pAVar1 = (pAVar3->field_6).pCopy;
        pAVar3 = Abc_ObjFanin0Ntk(pAVar3);
        pcVar4 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar1,pcVar4,(char *)0x0);
      }
    }
    for (iVar2 = 0; iVar2 < pNtk->vBoxes->nSize; iVar2 = iVar2 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar2);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 8) {
        pAVar1 = (pAVar3->field_6).pCopy;
        pcVar4 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar1,pcVar4,(char *)0x0);
      }
    }
    return;
  }
  __assert_fail("Nm_ManNumEntries(pNtkNew->pManName) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                ,0xb0,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkTrasferNamesNoLatches( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew) );
    assert( Nm_ManNumEntries(pNtk->pManName) > 0 );
    assert( Nm_ManNumEntries(pNtkNew->pManName) == 0 );
    // copy the CI/CO/box name and skip latches and theirs inputs/outputs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFaninNum(pObj) == 0 || !Abc_ObjIsLatch(Abc_ObjFanin0(pObj)) )
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanout0Ntk(pObj)), NULL );
    Abc_NtkForEachCo( pNtk, pObj, i ) 
        if ( Abc_ObjFanoutNum(pObj) == 0 || !Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) )
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanin0Ntk(pObj)), NULL );
    Abc_NtkForEachBox( pNtk, pObj, i ) 
        if ( !Abc_ObjIsLatch(pObj) )
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
}